

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O3

Vec3 cert::trace(Ray *r,World *world,int depth)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  int depth_00;
  float fVar4;
  float fVar5;
  Vec3 VVar6;
  Vec3 VVar7;
  Vec3 VVar8;
  HitRecord rec;
  ScatterOut out;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  HitRecord local_98;
  char local_64 [12];
  float local_58;
  Ray local_54;
  float local_3c;
  Ray local_38;
  
  World::hit(&local_98,world,r,0.001,3.4028235e+38);
  if (local_98.hit == true) {
    if (depth < 6) {
      VVar7.z = local_98.p.z;
      VVar7.x = local_98.p.x;
      VVar7.y = local_98.p.y;
      VVar8.z = local_98.normal.z;
      VVar8.x = local_98.normal.x;
      VVar8.y = local_98.normal.y;
      VVar7 = World::light_hit(world,VVar7,VVar8);
      (*(local_98.mat)->_vptr_Material[2])
                (local_98.p.x,local_98.p.z,local_98.normal.x,local_98.normal.z,local_98.uv,local_64,
                 local_98.mat,r,world);
      if (0.0 <= local_3c) {
        depth_00 = depth + 1;
        if (1.0 <= local_3c) {
          VVar7 = trace(&local_38,world,depth_00);
          fVar4 = VVar7.z;
          local_a8 = VVar7.x;
          fStack_a4 = VVar7.y;
        }
        else {
          VVar7 = trace(&local_54,world,depth_00);
          VVar8 = trace(&local_38,world,depth_00);
          fVar5 = 1.0 - local_3c;
          fVar4 = VVar8.z * fVar5 + VVar7.z * local_3c;
          local_b8 = VVar7.x;
          fStack_b4 = VVar7.y;
          local_a8 = fVar5 * VVar8.x + local_3c * local_b8;
          fStack_a4 = fVar5 * VVar8.y + local_3c * fStack_b4;
        }
      }
      else {
        local_a8 = VVar7.x;
        fStack_a4 = VVar7.y;
        local_a8 = local_a8 * (float)local_64._4_8_;
        fStack_a4 = fStack_a4 * SUB84(local_64._4_8_,4);
        fVar4 = VVar7.z * local_58;
        if (local_64[0] == '\x01') {
          VVar7 = trace(&local_54,world,depth + 1);
          local_a8 = local_a8 * VVar7.x;
          fStack_a4 = fStack_a4 * VVar7.y;
          fVar4 = fVar4 * VVar7.z;
        }
      }
    }
    else {
      fVar4 = 0.0;
      local_a8 = 0.0;
      fStack_a4 = 0.0;
    }
  }
  else {
    uVar1 = (r->direction).x;
    uVar2 = (r->direction).y;
    fVar5 = (r->direction).z;
    dVar3 = sqrt((double)(ulong)(uint)(fVar5 * fVar5 +
                                      (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2));
    fVar5 = ((float)uVar2 / SUB84(dVar3,0) + 1.0) * 0.5;
    fStack_a4 = 1.0 - fVar5;
    fVar4 = fStack_a4 + fVar5;
    local_a8 = fStack_a4 + fVar5 * 0.5;
    fStack_a4 = fStack_a4 + fVar5 * 0.7;
  }
  VVar6.y = fStack_a4;
  VVar6.x = local_a8;
  VVar6.z = fVar4;
  return VVar6;
}

Assistant:

constexpr Vec3 trace (const Ray& r, World& world, int depth)
{
	HitRecord rec = world.hit (r, 0.001, std::numeric_limits<float>::max ());
	if (rec.hit)
	{
		if (depth > max_bounces) return VEC3_ZERO;

		auto light_contribution = world.light_hit (rec.p, rec.normal);

		ScatterOut out = rec.mat->scatter (rec.p, rec.normal, rec.uv, r, world.random);
		if (out.index >= 0.0f)
		{
			if (out.index >= 1.0f)
			{
				return trace (out.refracted, world, depth + 1);
			}
			else
			{
				Vec3 reflect_contrib = trace (out.scattered, world, depth + 1);
				Vec3 refract_contrib = trace (out.refracted, world, depth + 1);
				return out.index * reflect_contrib + (1.0 - out.index) * refract_contrib;
			}
		}
		else if (out.is_scattered)
		{
			return light_contribution * out.attenuation * trace (out.scattered, world, depth + 1);
		}
		else
		{
			return light_contribution * out.attenuation;
		}
	}
	else
	{
		return background_color (r.direction);
	}
}